

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O3

void anurbs::Ref<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>::
     register_python(module *m)

{
  long *plVar1;
  undefined8 *puVar2;
  class_<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>> *pcVar3;
  ulong uVar4;
  string name;
  type local_9a;
  type local_99;
  class_<anurbs::Ref<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>
  local_98;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  code *local_70;
  long local_68;
  ulong local_60 [2];
  code *local_50;
  long local_48;
  ulong local_40 [2];
  code *local_30;
  undefined8 local_28;
  code *local_20;
  undefined8 local_18;
  
  local_50 = (code *)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Ref","");
  Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>::type_name_abi_cxx11_();
  uVar4 = 0xf;
  if (local_50 != (code *)local_40) {
    uVar4 = local_40[0];
  }
  if (uVar4 < (ulong)(local_68 + local_48)) {
    uVar4 = 0xf;
    if (local_70 != (code *)local_60) {
      uVar4 = local_60[0];
    }
    if ((ulong)(local_68 + local_48) <= uVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      goto LAB_00283f4d;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
LAB_00283f4d:
  local_90 = &local_80;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_80 = *plVar1;
    uStack_78 = puVar2[3];
  }
  else {
    local_80 = *plVar1;
    local_90 = (long *)*puVar2;
  }
  local_88 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  if (local_70 != (code *)local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_50 != (code *)local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pybind11::
  class_<anurbs::Ref<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>::
  class_<>(&local_98,(m->super_object).super_handle.m_ptr,(char *)local_90);
  pcVar3 = (class_<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>> *
           )pybind11::
            class_<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>>::
            def<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>::register_python(pybind11::module&)::_lambda(anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>const&)_1_>
                      ((class_<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>>
                        *)&local_98,"__len__",&local_99);
  pcVar3 = (class_<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>> *
           )pybind11::
            class_<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>>::
            def<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>::register_python(pybind11::module&)::_lambda(anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>const&,int)_1_>
                      (pcVar3,"__getitem__",&local_9a);
  local_50 = Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>::key_abi_cxx11_;
  local_48 = 0;
  pcVar3 = (class_<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>> *
           )pybind11::
            class_<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>>::
            def_property_readonly<std::__cxx11::string(anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>::*)()const>
                      (pcVar3,"key",(offset_in_Model_to_subr *)&local_50);
  local_70 = Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>::
             type_name_abi_cxx11_;
  local_68 = 0;
  pcVar3 = (class_<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>> *
           )pybind11::
            class_<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>>::
            def_property_readonly<std::__cxx11::string(anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>::*)()const>
                      (pcVar3,"type",(offset_in_Model_to_subr *)&local_70);
  local_20 = data;
  local_18 = 0;
  pcVar3 = (class_<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>> *
           )pybind11::
            class_<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>>::
            def_property_readonly<std::shared_ptr<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>(anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>::*)()const>
                      (pcVar3,"data",(offset_in_Model_to_subr *)&local_20);
  local_30 = attributes;
  local_28 = 0;
  pybind11::class_<anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>>::
  def_property_readonly<std::shared_ptr<anurbs::Attributes>(anurbs::Ref<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>::*)()const>
            (pcVar3,"attributes",(offset_in_Model_to_subr *)&local_30);
  pybind11::object::~object((object *)&local_98);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = std::string("Ref") + TData::type_name();

        py::class_<Type>(m, name.c_str())
            // methods
            .def("__len__", [](const Type& self) { return 2; })
            .def("__getitem__", [](const Type& self, const int i) -> py::object {
                switch (i) {
                case 0:
                    return py::cast(self.key());
                case 1:
                    return py::cast(self.data());
                default:
                    throw py::index_error();
                }
            })
            // read-only properties
            .def_property_readonly("key", &Type::key)
            .def_property_readonly("type", &Type::type_name)
            .def_property_readonly("data", &Type::data)
            .def_property_readonly("attributes", &Type::attributes)
        ;
    }